

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall ArgTest_StringArg_Test::TestBody(ArgTest_StringArg_Test *this)

{
  mock_visitor<const_char_*> *pmVar1;
  MockSpec<test_result_(const_char_*)> *this_00;
  size_t sVar2;
  MockSpec<test_result_(fmt::v5::basic_string_view<char>)> *this_01;
  basic_string_view<char> value;
  char str_data [5];
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<const_char_*>_> visitor;
  allocator local_121;
  char local_120 [8];
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_118;
  _func_int **local_f8;
  size_t sStack_f0;
  _func_int *local_e8 [2];
  StrictMock<mock_visitor<const_char_*>_> local_d8;
  
  builtin_strncpy(local_120,"test",5);
  testing::StrictMock<mock_visitor<const_char_*>_>::StrictMock(&local_d8);
  testing::Matcher<const_char_*>::Matcher((Matcher<const_char_*> *)&local_118,local_120);
  pmVar1 = &local_d8.super_mock_visitor<const_char_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  this_00 = testing::internal::FunctionMocker<test_result_(const_char_*)>::With
                      (&pmVar1->gmock1_visit_268,(Matcher<const_char_*> *)&local_118);
  testing::internal::MockSpec<test_result_(const_char_*)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x161,"visitor","visit(cstr)");
  local_118.value_.field_0.double_value = (double)&PTR__MatcherBase_001d3fb8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<const_char_*>_> *)
             ((long)&local_118.value_.field_0 + 8));
  local_118.type_ = cstring_type;
  local_118.value_.field_0.string.value = local_120;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<char_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d8,&local_118);
  testing::StrictMock<mock_visitor<const_char_*>_>::~StrictMock(&local_d8);
  sVar2 = strlen(local_120);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_>::StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *)&local_d8);
  value.size_ = sVar2;
  value.data_ = local_120;
  testing::Matcher<fmt::v5::basic_string_view<char>_>::Matcher
            ((Matcher<fmt::v5::basic_string_view<char>_> *)&local_118,value);
  pmVar1 = &local_d8.super_mock_visitor<const_char_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  this_01 = testing::internal::FunctionMocker<test_result_(fmt::v5::basic_string_view<char>)>::With
                      ((FunctionMocker<test_result_(fmt::v5::basic_string_view<char>)> *)pmVar1,
                       (Matcher<fmt::v5::basic_string_view<char>_> *)&local_118);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<char>)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x164,"visitor","visit(sref)");
  local_118.value_.field_0.double_value = (double)&PTR__MatcherBase_001d3fe8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<char>_>_>
  ::~linked_ptr((linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<char>_>_> *)
                ((long)&local_118.value_.field_0 + 8));
  std::__cxx11::string::string((string *)&local_f8,local_120,&local_121);
  local_118.type_ = string_type;
  local_118.value_.field_0.pointer = local_f8;
  local_118.value_.field_0.string.size = sStack_f0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *)&local_d8,&local_118);
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_>::~StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *)&local_d8);
  return;
}

Assistant:

TEST(ArgTest, StringArg) {
  char str_data[] = "test";
  char *str = str_data;
  const char *cstr = str;
  CHECK_ARG_(char, cstr, str);

  string_view sref(str);
  CHECK_ARG_(char, sref, std::string(str));
}